

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

int gdImageColorAllocateAlpha(gdImagePtr im,int r,int g,int b,int a)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (im->trueColor != 0) {
    return b + a * 0x1000000 + g * 0x100 + r * 0x10000;
  }
  uVar1 = im->colorsTotal;
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  do {
    if (uVar3 == uVar2) {
      if (uVar1 == 0x100) {
        return -1;
      }
      im->colorsTotal = uVar1 + 1;
LAB_0010b43c:
      im->red[(int)uVar1] = r;
      im->green[(int)uVar1] = g;
      im->blue[(int)uVar1] = b;
      im->alpha[(int)uVar1] = a;
      im->open[(int)uVar1] = 0;
      return uVar1;
    }
    if (im->open[uVar2] != 0) {
      uVar1 = (uint)uVar2;
      goto LAB_0010b43c;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

BGD_DECLARE(int) gdImageColorAllocateAlpha (gdImagePtr im, int r, int g, int b, int a)
{
	int i;
	int ct = (-1);
	if (im->trueColor) {
		return gdTrueColorAlpha (r, g, b, a);
	}
	for (i = 0; (i < (im->colorsTotal)); i++) {
		if (im->open[i]) {
			ct = i;
			break;
		}
	}
	if (ct == (-1)) {
		ct = im->colorsTotal;
		if (ct == gdMaxColors) {
			return -1;
		}
		im->colorsTotal++;
	}
	im->red[ct] = r;
	im->green[ct] = g;
	im->blue[ct] = b;
	im->alpha[ct] = a;
	im->open[ct] = 0;
	return ct;
}